

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsim_context.cpp
# Opt level: O0

ModelCircuit * __thiscall
lsim::LSimContext::find_circuit(LSimContext *this,char *name,ModelCircuitLibrary *fallback_lib)

{
  bool bVar1;
  long lVar2;
  pointer ppVar3;
  pointer this_00;
  char *name_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_true>
  local_c8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_true>
  local_c0;
  iterator found;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> circuit_name;
  key_type local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> lib_name;
  LSimContext *local_70;
  ModelCircuit *result;
  size_type separator;
  allocator local_49;
  string local_48 [8];
  string qualified;
  ModelCircuitLibrary *fallback_lib_local;
  char *name_local;
  LSimContext *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,name,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  lVar2 = std::__cxx11::string::find_first_of((char)local_48,0x2e);
  if (lVar2 == -1) {
    local_70 = (LSimContext *)0x0;
    if (fallback_lib != (ModelCircuitLibrary *)0x0) {
      local_70 = (LSimContext *)ModelCircuitLibrary::circuit_by_name(fallback_lib,name);
    }
    if (local_70 == (LSimContext *)0x0) {
      local_70 = (LSimContext *)ModelCircuitLibrary::circuit_by_name(&this->m_user_library,name);
    }
    this_local = local_70;
  }
  else {
    std::__cxx11::string::substr((ulong)local_98,(ulong)local_48);
    std::__cxx11::string::substr((ulong)&found,(ulong)local_48);
    local_c0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>_>_>
         ::find(&this->m_reference_libraries,local_98);
    local_c8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>_>_>
         ::end(&this->m_reference_libraries);
    bVar1 = std::__detail::operator!=(&local_c0,&local_c8);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_false,_true>
                             *)&local_c0);
      this_00 = std::
                unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>
                ::operator->(&ppVar3->second);
      name_00 = (char *)std::__cxx11::string::c_str();
      this_local = (LSimContext *)ModelCircuitLibrary::circuit_by_name(this_00,name_00);
    }
    else {
      this_local = (LSimContext *)0x0;
    }
    std::__cxx11::string::~string((string *)&found);
    std::__cxx11::string::~string((string *)local_98);
  }
  std::__cxx11::string::~string(local_48);
  return (ModelCircuit *)this_local;
}

Assistant:

ModelCircuit *LSimContext::find_circuit(const char *name, ModelCircuitLibrary *fallback_lib) {
    std::string qualified = name;
    auto separator = qualified.find_first_of('.');

    if (separator == std::string::npos) {
        ModelCircuit *result = nullptr;
        if (fallback_lib != nullptr) {
            result = fallback_lib->circuit_by_name(name);
        }
        if (result == nullptr) {
            result = m_user_library.circuit_by_name(name);
        }
        return result;
    }

    auto lib_name = qualified.substr(0, separator);
    auto circuit_name = qualified.substr(separator+1);

    auto found = m_reference_libraries.find(lib_name);
    if (found != m_reference_libraries.end()) {
        return found->second->circuit_by_name(circuit_name.c_str());
    }

    return nullptr;
}